

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O3

void * __thiscall
tvm::runtime::WorkspacePool::Pool::Alloc(Pool *this,TVMContext ctx,DeviceAPI *device,size_t nbytes)

{
  pointer *ppEVar1;
  undefined8 *puVar2;
  iterator __position;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  pointer pEVar7;
  ulong uVar8;
  Entry e;
  Entry local_38;
  
  uVar6 = nbytes + 0xfff & 0xfffffffffffff000;
  uVar8 = 0x1000;
  if (uVar6 != 0) {
    uVar8 = uVar6;
  }
  pEVar7 = (this->free_list_).
           super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pEVar7 -
          (long)(this->free_list_).
                super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (lVar4 != 1) {
    if (lVar4 == 2) {
      local_38.data = pEVar7[-1].data;
      local_38.size = pEVar7[-1].size;
      (this->free_list_).
      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar7 + -1;
      if (uVar8 <= local_38.size) goto LAB_0010a70c;
    }
    else {
      if (uVar8 <= pEVar7[-1].size) {
        lVar4 = 0;
        do {
          lVar5 = lVar4;
          lVar4 = lVar5 + -0x10;
        } while (uVar8 <= *(ulong *)((long)pEVar7 + lVar5 + -0x18));
        puVar2 = (undefined8 *)((long)&pEVar7[-1].data + lVar5);
        local_38.data = (void *)*puVar2;
        local_38.size = puVar2[1];
        if ((pointer)(puVar2 + 2) != pEVar7) {
          memmove((void *)((long)&pEVar7[-1].data + lVar5),(pointer)(puVar2 + 2),
                  -(lVar5 + -0x10) - 0x10);
          pEVar7 = (this->free_list_).
                   super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        (this->free_list_).
        super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
        ._M_impl.super__Vector_impl_data._M_finish = pEVar7 + -1;
        goto LAB_0010a70c;
      }
      local_38.data = pEVar7[-1].data;
      local_38.size = pEVar7[-1].size;
      (this->free_list_).
      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar7 + -1;
    }
    (*device->_vptr_DeviceAPI[5])(device,ctx,local_38.data);
  }
  iVar3 = (*device->_vptr_DeviceAPI[4])(device,ctx,uVar8,0x40,0x10801);
  local_38.data = (void *)CONCAT44(extraout_var,iVar3);
  local_38.size = uVar8;
LAB_0010a70c:
  __position._M_current =
       (this->allocated_).
       super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->allocated_).
      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
    ::_M_realloc_insert<tvm::runtime::WorkspacePool::Pool::Entry_const&>
              ((vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
                *)&this->allocated_,__position,&local_38);
  }
  else {
    (__position._M_current)->data = local_38.data;
    (__position._M_current)->size = local_38.size;
    ppEVar1 = &(this->allocated_).
               super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return local_38.data;
}

Assistant:

void *Alloc(TVMContext ctx, DeviceAPI *device, size_t nbytes) {
    // Allocate align to page.
    nbytes = (nbytes + (kWorkspacePageSize - 1)) / kWorkspacePageSize * kWorkspacePageSize;
    if (nbytes == 0)
      nbytes = kWorkspacePageSize;
    Entry e;
    TVMType type;
    type.code = kDLUInt;
    type.bits = 8;
    type.lanes = 1;
    if (free_list_.size() == 2) {
      e = free_list_.back();
      free_list_.pop_back();
      if (e.size < nbytes) {
        // resize the page
        device->FreeDataSpace(ctx, e.data);
        e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
        e.size = nbytes;
      }
    } else if (free_list_.size() == 1) {
      e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
      e.size = nbytes;
    } else {
      if (free_list_.back().size >= nbytes) {
        // find smallest fit
        auto it = free_list_.end() - 2;
        for (; it->size >= nbytes; --it) {
        }
        e = *(it + 1);
        free_list_.erase(it + 1);
      } else {
        // resize the page
        e = free_list_.back();
        free_list_.pop_back();
        device->FreeDataSpace(ctx, e.data);
        e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
        e.size = nbytes;
      }
    }
    allocated_.push_back(e);
    return e.data;
  }